

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_hand.cc
# Opt level: O1

string * __thiscall
hanabi_learning_env::HanabiHand::CardKnowledge::ToString_abi_cxx11_
          (string *__return_storage_ptr__,CardKnowledge *this)

{
  int iVar1;
  pointer pcVar2;
  long *plVar3;
  _Bit_type *p_Var4;
  long *plVar5;
  ulong uVar6;
  __string_type __str;
  undefined1 *local_90;
  ulong local_88;
  undefined1 local_80 [16];
  long *local_70;
  ulong local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = (this->color_).value_;
  if (-1 < iVar1) {
    ColorIndexToChar(iVar1);
  }
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + __return_storage_ptr__->_M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_90,local_88,0,'\x01');
  iVar1 = (this->rank_).value_;
  if (-1 < iVar1) {
    RankIndexToChar(iVar1);
  }
  plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_90,local_88,0,'\x01');
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar5;
    local_70 = (long *)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_68,0,'\x01');
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_40 = *plVar5;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar5;
    local_50 = (long *)*plVar3;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  p_Var4 = (this->color_).value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  if (0 < (int)((*(int *)&(this->color_).value_plausible_.super__Bvector_base<std::allocator<bool>_>
                          ._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                - (int)p_Var4) * 8 +
               *(uint *)((long)&(this->color_).value_plausible_.
                                super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8))) {
    uVar6 = 0;
    do {
      if ((p_Var4[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0) {
        ColorIndexToChar((int)uVar6);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      uVar6 = uVar6 + 1;
      p_Var4 = (this->color_).value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    } while ((long)uVar6 <
             (long)(int)((*(int *)&(this->color_).value_plausible_.
                                   super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                         - (int)p_Var4) * 8 +
                        *(uint *)((long)&(this->color_).value_plausible_.
                                         super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base
                                 + 8)));
  }
  p_Var4 = (this->rank_).value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  if (0 < (int)((*(int *)&(this->rank_).value_plausible_.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                (int)p_Var4) * 8 +
               *(uint *)((long)&(this->rank_).value_plausible_.
                                super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8))) {
    uVar6 = 0;
    do {
      if ((p_Var4[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0) {
        RankIndexToChar((int)uVar6);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      uVar6 = uVar6 + 1;
      p_Var4 = (this->rank_).value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    } while ((long)uVar6 <
             (long)(int)((*(int *)&(this->rank_).value_plausible_.
                                   super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                         - (int)p_Var4) * 8 +
                        *(uint *)((long)&(this->rank_).value_plausible_.
                                         super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base
                                 + 8)));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HanabiHand::CardKnowledge::ToString() const {
  std::string result;
  result = result + (ColorHinted() ? ColorIndexToChar(Color()) : 'X') +
           (RankHinted() ? RankIndexToChar(Rank()) : 'X') + '|';
  for (int c = 0; c < color_.Range(); ++c) {
    if (color_.IsPlausible(c)) {
      result += ColorIndexToChar(c);
    }
  }
  for (int r = 0; r < rank_.Range(); ++r) {
    if (rank_.IsPlausible(r)) {
      result += RankIndexToChar(r);
    }
  }
  return result;
}